

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O2

void __thiscall ASDCP::Dictionary::Dump(Dictionary *this,FILE *stream)

{
  char *pcVar1;
  long lVar2;
  UL local_98;
  char str_buf [64];
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  for (lVar2 = 0xa8; lVar2 != 0x4968; lVar2 = lVar2 + 0x20) {
    if (*(long *)(&(this->m_md_lookup)._M_t._M_impl.field_0x0 + lVar2) != 0) {
      local_98.super_Identifier<16U>.m_HasValue = true;
      local_98.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)((long)this + lVar2 + -0x18);
      local_98.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)((long)this + lVar2 + -0x10);
      local_98.super_Identifier<16U>.super_IArchive._vptr_IArchive =
           (_func_int **)&PTR__IArchive_002112c8;
      pcVar1 = UL::EncodeString(&local_98,str_buf,0x40);
      fprintf((FILE *)stream,"%s: %s\n",pcVar1,
              *(undefined8 *)(&(this->m_md_lookup)._M_t._M_impl.field_0x0 + lVar2));
    }
  }
  return;
}

Assistant:

void
ASDCP::Dictionary::Dump(FILE* stream) const
{
  if ( stream == 0 )
    stream = stderr;

  MDD_t di = (MDD_t)0;
  char     str_buf[64];

  while ( di < MDD_Max )
    {
      if ( m_MDD_Table[di].name != 0 )
	{
	  UL TmpUL(m_MDD_Table[di].ul);
	  fprintf(stream, "%s: %s\n", TmpUL.EncodeString(str_buf, 64), m_MDD_Table[di].name);
	}

      di = (MDD_t)(di + 1);
    }
}